

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_shmtx.c
# Opt level: O0

void ngx_shmtx_destroy(ngx_shmtx_t *mtx)

{
  ngx_shmtx_t *mtx_local;
  
  return;
}

Assistant:

void
ngx_shmtx_destroy(ngx_shmtx_t *mtx)
{
#if (NGX_HAVE_POSIX_SEM)

    if (mtx->semaphore) {
        if (sem_destroy(&mtx->sem) == -1) {
            ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, ngx_errno,
                          "sem_destroy() failed");
        }
    }

#endif
}